

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86_avx512::create_pipeline(DeformableConv2D_x86_avx512 *this,Option *opt)

{
  Mat *pMVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  Allocator *pAVar5;
  long *plVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int _h;
  int *piVar11;
  Layer *pLVar12;
  int _w;
  int i;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 *puVar17;
  _func_int *p_Var18;
  int iVar19;
  undefined4 *puVar20;
  undefined4 *puVar21;
  undefined4 *puVar22;
  bool bVar23;
  ParamDict permute_pd;
  ParamDict pd;
  Mat local_128;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined8 local_a0;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  void *local_38;
  
  pMVar1 = (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]);
  iVar19 = (int)pMVar1[-2].elemsize;
  _w = pMVar1[-2].elempack * *(int *)((long)&pMVar1[-2].elemsize + 4);
  uVar14 = (long)(int)pMVar1[-2].cstep / (long)(_w * iVar19);
  _h = (int)uVar14;
  Mat::reshape(&local_98,pMVar1,_w,_h,iVar19,(Allocator *)0x0);
  pMVar1 = &this->weight_data_t;
  p_Var18 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  Mat::create(pMVar1,_h,
              *(int *)(&this->field_0xd8 + (long)p_Var18) *
              *(int *)(&this->field_0xd4 + (long)p_Var18),
              *(int *)(&this->field_0xd0 + (long)p_Var18),4,(Allocator *)0x0);
  local_38 = pMVar1->data;
  iVar19 = -100;
  if ((local_38 != (void *)0x0) &&
     (sVar2 = (this->weight_data_t).cstep, (long)(this->weight_data_t).c * sVar2 != 0)) {
    pp_Var3 = this->_vptr_DeformableConv2D_x86_avx512;
    sVar4 = (this->weight_data_t).elemsize;
    uVar15 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (_h < 1) {
      uVar14 = uVar15;
    }
    p_Var18 = pp_Var3[-3];
    puVar22 = (undefined4 *)local_98.data;
    for (; (long)uVar15 < (long)*(int *)(&this->field_0xd0 + (long)p_Var18); uVar15 = uVar15 + 1) {
      puVar20 = (undefined4 *)(sVar2 * sVar4 * uVar15 + (long)local_38);
      puVar17 = puVar22;
      for (lVar13 = 0; uVar16 = uVar14, puVar21 = puVar17,
          lVar13 < (long)*(int *)(&this->field_0xd8 + (long)p_Var18) *
                   (long)*(int *)(&this->field_0xd4 + (long)p_Var18); lVar13 = lVar13 + 1) {
        while (bVar23 = uVar16 != 0, uVar16 = uVar16 - 1, bVar23) {
          *puVar20 = *puVar21;
          puVar20 = puVar20 + 1;
          puVar21 = (undefined4 *)
                    ((long)puVar21 +
                    (long)local_98.w *
                    CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
        }
        p_Var18 = pp_Var3[-3];
        puVar17 = puVar17 + 1;
      }
      puVar22 = (undefined4 *)
                ((long)puVar22 +
                CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * local_98.cstep);
    }
    piVar11 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    local_48 = pMVar1;
    local_40 = opt;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          free(local_98.data);
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.c = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    p_Var18 = this->_vptr_DeformableConv2D_x86_avx512[-3];
    Mat::reshape(&local_128,pMVar1,
                 *(int *)(&this->field_0xd4 + (long)p_Var18) * _h *
                 *(int *)(&this->field_0xd8 + (long)p_Var18),
                 *(int *)(&this->field_0xd0 + (long)p_Var18),(Allocator *)0x0);
    piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (pMVar1 != &local_128) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->weight_data_t).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pAVar5 = (this->weight_data_t).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            free((this->weight_data_t).data);
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).data = local_128.data;
      (this->weight_data_t).refcount =
           (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).elemsize =
           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      (this->weight_data_t).elempack = local_128.elempack;
      (this->weight_data_t).allocator = local_128.allocator;
      (this->weight_data_t).dims = local_128.dims;
      (this->weight_data_t).w = local_128.w;
      (this->weight_data_t).h = local_128.h;
      (this->weight_data_t).d = local_128.d;
      (this->weight_data_t).c = local_128.c;
      (this->weight_data_t).cstep = local_128.cstep;
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          free(local_128.data);
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pLVar12 = create_layer(0xf);
    this->inner_product = pLVar12;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(int *)(&this->field_0xd0 +
                                 (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    ParamDict::set(&pd,1,*(int *)(&this->field_0xfc +
                                 (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    ParamDict::set(&pd,2,*(int *)(&this->field_0x100 +
                                 (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    ParamDict::set(&pd,9,*(int *)(&this->field_0x104 +
                                 (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    ParamDict::set(&pd,10,(Mat *)(&this->field_0x108 +
                                 (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    (*this->inner_product->_vptr_Layer[2])(this->inner_product,&pd);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    if (&local_128 != pMVar1) {
      piVar11 = (this->weight_data_t).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_128.data = (this->weight_data_t).data;
      piVar11 = (this->weight_data_t).refcount;
      local_128.refcount._0_4_ = SUB84(piVar11,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
      sVar2 = (this->weight_data_t).elemsize;
      local_128.elemsize._0_4_ = (undefined4)sVar2;
      local_128.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      local_128.elempack = (this->weight_data_t).elempack;
      local_128.allocator = (this->weight_data_t).allocator;
      uVar7 = (this->weight_data_t).dims;
      uVar8 = (this->weight_data_t).w;
      uVar9 = (this->weight_data_t).h;
      uVar10 = (this->weight_data_t).d;
      local_128.c = (this->weight_data_t).c;
      local_128.cstep = (this->weight_data_t).cstep;
      local_128.dims = uVar7;
      local_128.w = uVar8;
      local_128.h = uVar9;
      local_128.d = uVar10;
    }
    local_a0 = 0;
    local_a8 = 0;
    uStack_ac = 0;
    uStack_b0 = 0;
    uStack_b4 = 0;
    uStack_b8 = 0;
    local_c0 = 0;
    local_c8 = 0;
    uStack_cc = 0;
    local_d0 = 0;
    uStack_d4 = 0;
    uStack_d8 = 0;
    local_e0 = 0;
    p_Var18 = this->_vptr_DeformableConv2D_x86_avx512[-3];
    if ((*(int *)(&this->field_0xfc + (long)p_Var18) != 0) &&
       (&local_e0 != (undefined8 *)(&this->field_0x198 + (long)p_Var18))) {
      piVar11 = *(int **)(&this->field_0x1a0 + (long)p_Var18);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_e0 = *(undefined8 *)(&this->field_0x198 + (long)p_Var18);
      uStack_d8 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var18);
      uStack_d4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var18) >> 0x20);
      local_d0 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var18);
      uStack_cc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var18) >> 0x20);
      local_c8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var18);
      local_c0 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var18);
      uStack_b8 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var18);
      uStack_b4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var18) >> 0x20);
      uStack_b0 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var18);
      uStack_ac = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var18) >> 0x20);
      local_a8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var18);
      local_a0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var18);
    }
    pLVar12 = this->inner_product;
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&permute_pd,&local_128);
    (*pLVar12->_vptr_Layer[3])(pLVar12,&permute_pd);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&permute_pd);
    (*this->inner_product->_vptr_Layer[4])();
    pLVar12 = create_layer(0x2f);
    this->permute = pLVar12;
    ParamDict::ParamDict(&permute_pd);
    ParamDict::set(&permute_pd,0,1);
    (*this->permute->_vptr_Layer[2])(this->permute,&permute_pd);
    (*this->permute->_vptr_Layer[4])(this->permute,opt);
    ParamDict::~ParamDict(&permute_pd);
    lVar13 = 0x48;
    do {
      piVar11 = *(int **)((long)&local_128.refcount + lVar13);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          plVar6 = *(long **)((long)&local_128.allocator + lVar13);
          if (plVar6 == (long *)0x0) {
            free(*(void **)((long)&local_128.data + lVar13));
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_128.cstep + lVar13) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_128.elemsize + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_128.data + lVar13) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar13) = 0;
      *(undefined4 *)((long)&local_128.c + lVar13) = 0;
      *(undefined8 *)((long)&local_128.dims + lVar13) = 0;
      *(undefined8 *)((long)&local_128.h + lVar13) = 0;
      lVar13 = lVar13 + -0x48;
    } while (lVar13 != -0x48);
    ParamDict::~ParamDict(&pd);
    iVar19 = 0;
  }
  piVar11 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int DeformableConv2D_x86_avx512::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}